

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_clump.c
# Opt level: O1

REF_STATUS ref_clump_around(REF_GRID_conflict ref_grid,REF_INT node,char *filename)

{
  int iVar1;
  REF_CELL pRVar2;
  REF_ADJ_ITEM pRVar3;
  REF_GRID_conflict pRVar4;
  uint uVar5;
  FILE *__s;
  undefined8 uVar6;
  char *pcVar7;
  REF_INT RVar8;
  long lVar9;
  ulong uVar10;
  REF_DICT node_dict;
  REF_DICT tet_dict;
  REF_DICT tri_dict;
  REF_INT nodes [27];
  REF_DICT local_d8;
  REF_DICT local_d0;
  REF_DICT local_c8;
  REF_DICT local_c0;
  REF_GRID_conflict local_b8;
  char *local_b0;
  REF_INT local_a8 [30];
  
  uVar5 = ref_dict_create(&local_d8);
  if (uVar5 == 0) {
    uVar5 = ref_dict_create(&local_c0);
    if (uVar5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0x86,
             "ref_clump_around",(ulong)uVar5,"create tris");
      return uVar5;
    }
    uVar5 = ref_dict_create(&local_c8);
    if (uVar5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0x87,
             "ref_clump_around",(ulong)uVar5,"create tets");
      return uVar5;
    }
    pRVar2 = ref_grid->cell[3];
    uVar10 = 0xffffffff;
    if (-1 < node) {
      uVar10 = 0xffffffff;
      if (node < pRVar2->ref_adj->nnode) {
        uVar10 = (ulong)(uint)pRVar2->ref_adj->first[(uint)node];
      }
    }
    local_b8 = ref_grid;
    local_b0 = filename;
    if ((int)uVar10 != -1) {
      RVar8 = pRVar2->ref_adj->item[(int)uVar10].ref;
      local_d0 = local_c0;
      do {
        uVar5 = ref_cell_nodes(pRVar2,RVar8,local_a8);
        if (uVar5 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x8c,"ref_clump_around",(ulong)uVar5,"n");
          return uVar5;
        }
        uVar5 = ref_dict_store(local_d0,RVar8,0);
        if (uVar5 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x8d,"ref_clump_around",(ulong)uVar5,"store");
          return uVar5;
        }
        if (0 < pRVar2->node_per) {
          lVar9 = 0;
          do {
            uVar5 = ref_dict_store(local_d8,local_a8[lVar9],0);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                     ,0x8f,"ref_clump_around",(ulong)uVar5,"store");
              return uVar5;
            }
            lVar9 = lVar9 + 1;
          } while (lVar9 < pRVar2->node_per);
        }
        pRVar3 = pRVar2->ref_adj->item;
        iVar1 = pRVar3[(int)uVar10].next;
        uVar10 = (ulong)iVar1;
        if (uVar10 == 0xffffffffffffffff) {
          RVar8 = -1;
        }
        else {
          RVar8 = pRVar3[uVar10].ref;
        }
      } while (iVar1 != -1);
    }
    pRVar2 = local_b8->cell[8];
    uVar10 = 0xffffffff;
    if (-1 < node) {
      uVar10 = 0xffffffff;
      if (node < pRVar2->ref_adj->nnode) {
        uVar10 = (ulong)(uint)pRVar2->ref_adj->first[(uint)node];
      }
    }
    if ((int)uVar10 != -1) {
      RVar8 = pRVar2->ref_adj->item[(int)uVar10].ref;
      local_d0 = local_c8;
      do {
        uVar5 = ref_cell_nodes(pRVar2,RVar8,local_a8);
        if (uVar5 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x94,"ref_clump_around",(ulong)uVar5,"n");
          return uVar5;
        }
        uVar5 = ref_dict_store(local_d0,RVar8,0);
        if (uVar5 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x95,"ref_clump_around",(ulong)uVar5,"store");
          return uVar5;
        }
        if (0 < pRVar2->node_per) {
          lVar9 = 0;
          do {
            uVar5 = ref_dict_store(local_d8,local_a8[lVar9],0);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                     ,0x97,"ref_clump_around",(ulong)uVar5,"store");
              return uVar5;
            }
            lVar9 = lVar9 + 1;
          } while (lVar9 < pRVar2->node_per);
        }
        pRVar3 = pRVar2->ref_adj->item;
        iVar1 = pRVar3[(int)uVar10].next;
        uVar10 = (ulong)iVar1;
        if (uVar10 == 0xffffffffffffffff) {
          RVar8 = -1;
        }
        else {
          RVar8 = pRVar3[uVar10].ref;
        }
      } while (iVar1 != -1);
    }
    pcVar7 = local_b0;
    __s = fopen(local_b0,"w");
    if (__s == (FILE *)0x0) {
      printf("unable to open %s\n",pcVar7);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0x9c,
             "ref_clump_around","unable to open file");
      return 2;
    }
    fwrite("title=\"tecplot refine clump file\"\n",0x22,1,__s);
    fwrite("variables = \"x\" \"y\" \"z\" \"xm\" \"ym\" \"zm\" \"g\"\n",0x2b,1,__s);
    pRVar4 = local_b8;
    uVar5 = ref_clump_zone_around
                      ((FILE *)__s,local_b8->cell[3],local_c0,"fetriangle",local_d8,local_b8->node,
                       node);
    if (uVar5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0xa6,
             "ref_clump_around",(ulong)uVar5,"zone");
      return uVar5;
    }
    uVar5 = ref_clump_zone_around
                      ((FILE *)__s,pRVar4->cell[8],local_c8,"fetetrahedron",local_d8,pRVar4->node,
                       node);
    if (uVar5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0xad,
             "ref_clump_around",(ulong)uVar5,"zone");
      return uVar5;
    }
    fclose(__s);
    uVar5 = ref_dict_free(local_c8);
    if (uVar5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0xb1,
             "ref_clump_around",(ulong)uVar5,"free tet");
      return uVar5;
    }
    uVar5 = ref_dict_free(local_c0);
    if (uVar5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0xb2,
             "ref_clump_around",(ulong)uVar5,"free tris");
      return uVar5;
    }
    uVar5 = ref_dict_free(local_d8);
    if (uVar5 == 0) {
      return 0;
    }
    pcVar7 = "free nodes";
    uVar6 = 0xb3;
  }
  else {
    pcVar7 = "create nodes";
    uVar6 = 0x85;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",uVar6,
         "ref_clump_around",(ulong)uVar5,pcVar7);
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_clump_around(REF_GRID ref_grid, REF_INT node,
                                    const char *filename) {
  REF_DICT node_dict, tri_dict, tet_dict;
  REF_DICT ref_dict;
  REF_CELL ref_cell;
  REF_INT item, cell, cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  const char *zonetype;

  FILE *f;

  RSS(ref_dict_create(&node_dict), "create nodes");
  RSS(ref_dict_create(&tri_dict), "create tris");
  RSS(ref_dict_create(&tet_dict), "create tets");

  ref_cell = ref_grid_tri(ref_grid);
  ref_dict = tri_dict;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    RSS(ref_dict_store(ref_dict, cell, 0), "store");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }
  ref_cell = ref_grid_tet(ref_grid);
  ref_dict = tet_dict;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    RSS(ref_dict_store(ref_dict, cell, 0), "store");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }

  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  fprintf(f, "title=\"tecplot refine clump file\"\n");
  fprintf(f, "variables = \"x\" \"y\" \"z\" \"xm\" \"ym\" \"zm\" \"g\"\n");

  ref_cell = ref_grid_tri(ref_grid);
  ref_dict = tri_dict;
  zonetype = "fetriangle";
  RSS(ref_clump_zone_around(f, ref_cell, ref_dict, zonetype, node_dict,
                            ref_grid_node(ref_grid), node),
      "zone");

  ref_cell = ref_grid_tet(ref_grid);
  ref_dict = tet_dict;
  zonetype = "fetetrahedron";
  RSS(ref_clump_zone_around(f, ref_cell, ref_dict, zonetype, node_dict,
                            ref_grid_node(ref_grid), node),
      "zone");

  fclose(f);

  RSS(ref_dict_free(tet_dict), "free tet");
  RSS(ref_dict_free(tri_dict), "free tris");
  RSS(ref_dict_free(node_dict), "free nodes");

  return REF_SUCCESS;
}